

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_put_array.c
# Opt level: O3

void put_array(int *xs,int n)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = bsp_nprocs();
  if (n % (int)uVar2 != 0) {
    bsp_abort("{put_array} n=%d not divisible by p=%d\n",n,(ulong)uVar2);
  }
  iVar1 = (int)((long)n / (long)(int)uVar2);
  bsp_push_reg(xs,iVar1 * 4);
  bsp_sync();
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      bsp_put(*(int *)((long)xs + lVar3) / iVar1,(void *)((long)xs + lVar3),xs,
              (*(int *)((long)xs + lVar3) % iVar1) * 4,4);
      lVar3 = lVar3 + 4;
    } while (((long)n / (long)(int)uVar2 & 0xffffffffU) << 2 != lVar3);
  }
  bsp_sync();
  bsp_pop_reg(xs);
  return;
}

Assistant:

void put_array( int * xs, int n ) {
    int i, dst_pid, dst_idx;
    int p = bsp_nprocs();
    int n_over_p = n/p;

    if ((n%p) != 0)
        bsp_abort("{put_array} n=%d not divisible by p=%d\n", n, p);
    bsp_push_reg( xs, n_over_p*sizeof(xs[0]));
    bsp_sync();

    for (i = 0; i < n_over_p; ++i) {
        dst_pid = xs[i] / n_over_p;
        dst_idx = xs[i] % n_over_p;
        bsp_put( dst_pid, &xs[i], xs, dst_idx*sizeof(xs[0]), sizeof(xs[0]));
    }
    bsp_sync();
    bsp_pop_reg(xs);
}